

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINGetJacNumIters(void *kinmem,long *nni_J)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_18;
  KINLsMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetJacNumIters",&local_18,&local_10);
  if (iVar1 == 0) {
    *nni_J = local_18->kin_nnilset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetJacNumIters(void* kinmem, long int* nni_J)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure; set output and return */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KINLS_SUCCESS) { return retval; }
  *nni_J = kin_mem->kin_nnilset;
  return KINLS_SUCCESS;
}